

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

fixed_precise_measurement *
units::root(fixed_precise_measurement *__return_storage_ptr__,fixed_precise_measurement *fpm,
           int power)

{
  double dVar1;
  precise_unit pVar2;
  precise_unit local_28;
  
  dVar1 = numericalRoot<double>(fpm->value_,power);
  local_28.multiplier_ = (fpm->units_).multiplier_;
  local_28.base_units_ = (fpm->units_).base_units_;
  local_28.commodity_ = (fpm->units_).commodity_;
  pVar2 = root(&local_28,power);
  __return_storage_ptr__->value_ = dVar1;
  __return_storage_ptr__->units_ = pVar2;
  return __return_storage_ptr__;
}

Assistant:

fixed_precise_measurement root(const fixed_precise_measurement& fpm, int power)
{
    return {numericalRoot(fpm.value(), power), root(fpm.units(), power)};
}